

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  unsigned_long_long uVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  unsigned_long_long uVar5;
  undefined1 auVar6 [16];
  
  uVar1 = pss + 1;
  uVar5 = 0;
  if (params.fParams.contentSizeFlag != 0) {
    uVar5 = uVar1;
  }
  zcs->streamStage = zcss_init;
  if (pss != 0) {
    uVar5 = uVar1;
  }
  zcs->pledgedSrcSizePlusOne = uVar5;
  auVar6._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
  auVar6._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
  auVar6._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
  auVar6._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
  iVar4 = movmskps((int)uVar1,auVar6);
  uVar3 = 0xffffffffffffffd6;
  if (((iVar4 == 0xf) && (0xfffffffa < params.cParams.minMatch - 8)) &&
     (params.cParams.targetLength < 0x20001)) {
    uVar3 = 0xffffffffffffffd6;
    if (0xfffffff6 < params.cParams.strategy + ~ZSTD_btultra2) {
      uVar3 = 0;
    }
  }
  if (uVar3 < 0xffffffffffffff89) {
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = (int)params.cParams._20_8_;
    (zcs->requestedParams).cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
    (zcs->requestedParams).cParams.windowLog = (int)params.cParams._0_8_;
    (zcs->requestedParams).cParams.chainLog = (int)((ulong)params.cParams._0_8_ >> 0x20);
    (zcs->requestedParams).cParams.hashLog = (int)params.cParams._8_8_;
    (zcs->requestedParams).cParams.searchLog = (int)((ulong)params.cParams._8_8_ >> 0x20);
    (zcs->requestedParams).fParams.contentSizeFlag = (int)params.fParams._0_8_;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)params.fParams._0_8_ >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 0;
    sVar2 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
    uVar3 = 0;
    if (0xffffffffffffff88 < sVar2) {
      uVar3 = sVar2;
    }
  }
  return uVar3;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}